

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

double nk_pow(double x,int n)

{
  undefined8 local_30;
  undefined4 local_28;
  double dStack_20;
  int plus;
  double r;
  double dStack_10;
  int n_local;
  double x_local;
  
  dStack_20 = 1.0;
  local_28 = n;
  if (n < 0) {
    local_28 = -n;
  }
  dStack_10 = x;
  for (r._4_4_ = local_28; 0 < (int)r._4_4_; r._4_4_ = (int)r._4_4_ / 2) {
    if ((r._4_4_ & 1) == 1) {
      dStack_20 = dStack_10 * dStack_20;
    }
    dStack_10 = dStack_10 * dStack_10;
  }
  if (n < 0) {
    local_30 = 1.0 / dStack_20;
  }
  else {
    local_30 = dStack_20;
  }
  return local_30;
}

Assistant:

NK_INTERN double
nk_pow(double x, int n)
{
    /*  check the sign of n */
    double r = 1;
    int plus = n >= 0;
    n = (plus) ? n : -n;
    while (n > 0) {
        if ((n & 1) == 1)
            r *= x;
        n /= 2;
        x *= x;
    }
    return plus ? r : 1.0 / r;
}